

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_setIntOptionValue(void *highs,char *option,HighsInt value)

{
  HighsStatus HVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,option,&local_39);
  HVar1 = Highs::setOptionValue((Highs *)highs,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_setIntOptionValue(void* highs, const char* option,
                                 const HighsInt value) {
  return (HighsInt)((Highs*)highs)->setOptionValue(std::string(option), value);
}